

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

reference __thiscall
absl::lts_20250127::
InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
::operator[](InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
             *this,size_type i)

{
  size_type sVar1;
  pointer pPVar2;
  anon_class_1_0_00000001 local_19;
  size_type local_18;
  size_type i_local;
  InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *this_local;
  
  local_18 = i;
  i_local = (size_type)this;
  sVar1 = size(this);
  if (sVar1 <= i) {
    operator[]::anon_class_1_0_00000001::operator()(&local_19);
  }
  pPVar2 = data(this);
  return pPVar2 + local_18;
}

Assistant:

reference operator[](size_type i) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    ABSL_HARDENING_ASSERT(i < size());
    return data()[i];
  }